

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O2

JBLOCKARRAY
access_virt_barray(j_common_ptr cinfo,jvirt_barray_ptr ptr,JDIMENSION start_row,JDIMENSION num_rows,
                  boolean writable)

{
  int iVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  JDIMENSION JVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar6 = num_rows + start_row;
  if (((ptr->rows_in_array < uVar6) || (ptr->maxaccess < num_rows)) ||
     (ptr->mem_buffer == (JBLOCKARRAY)0x0)) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x16;
    (*pjVar3->error_exit)(cinfo);
  }
  if ((start_row < ptr->cur_start_row) || (ptr->cur_start_row + ptr->rows_in_mem < uVar6)) {
    if (ptr->b_s_open == 0) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x45;
      (*pjVar3->error_exit)(cinfo);
    }
    if (ptr->dirty != 0) {
      do_barray_io(cinfo,ptr,1);
      ptr->dirty = 0;
    }
    JVar4 = start_row;
    if (start_row <= ptr->cur_start_row) {
      lVar5 = (ulong)uVar6 - (ulong)ptr->rows_in_mem;
      JVar4 = 0;
      if (0 < lVar5) {
        JVar4 = (JDIMENSION)lVar5;
      }
    }
    ptr->cur_start_row = JVar4;
    do_barray_io(cinfo,ptr,0);
  }
  uVar7 = ptr->first_undef_row;
  if (uVar7 < uVar6) {
    if (start_row <= uVar7) {
      if (writable != 0) goto LAB_0010f9e3;
      iVar1 = ptr->pre_zero;
joined_r0x0010fa53:
      if (iVar1 == 0) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x16;
        (*pjVar3->error_exit)(cinfo);
        goto LAB_0010fa31;
      }
LAB_0010f9fa:
      uVar2 = ptr->blocksperrow;
      JVar4 = ptr->cur_start_row;
      for (uVar8 = (ulong)(uVar7 - JVar4); uVar8 < uVar6 - JVar4; uVar8 = uVar8 + 1) {
        jzero_far(ptr->mem_buffer[uVar8],(ulong)uVar2 << 7);
      }
      goto LAB_0010fa25;
    }
    uVar7 = start_row;
    if (writable == 0) {
      iVar1 = ptr->pre_zero;
      goto joined_r0x0010fa53;
    }
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x16;
    (*pjVar3->error_exit)(cinfo);
LAB_0010f9e3:
    ptr->first_undef_row = uVar6;
    if (ptr->pre_zero != 0) goto LAB_0010f9fa;
  }
  else {
LAB_0010fa25:
    if (writable == 0) goto LAB_0010fa31;
  }
  ptr->dirty = 1;
LAB_0010fa31:
  return ptr->mem_buffer + (start_row - ptr->cur_start_row);
}

Assistant:

METHODDEF(JBLOCKARRAY)
access_virt_barray(j_common_ptr cinfo, jvirt_barray_ptr ptr,
                   JDIMENSION start_row, JDIMENSION num_rows, boolean writable)
/* Access the part of a virtual block array starting at start_row */
/* and extending for num_rows rows.  writable is true if  */
/* caller intends to modify the accessed area. */
{
  JDIMENSION end_row = start_row + num_rows;
  JDIMENSION undef_row;

  /* debugging check */
  if (end_row > ptr->rows_in_array || num_rows > ptr->maxaccess ||
      ptr->mem_buffer == NULL)
    ERREXIT(cinfo, JERR_BAD_VIRTUAL_ACCESS);

  /* Make the desired part of the virtual array accessible */
  if (start_row < ptr->cur_start_row ||
      end_row > ptr->cur_start_row + ptr->rows_in_mem) {
    if (!ptr->b_s_open)
      ERREXIT(cinfo, JERR_VIRTUAL_BUG);
    /* Flush old buffer contents if necessary */
    if (ptr->dirty) {
      do_barray_io(cinfo, ptr, TRUE);
      ptr->dirty = FALSE;
    }
    /* Decide what part of virtual array to access.
     * Algorithm: if target address > current window, assume forward scan,
     * load starting at target address.  If target address < current window,
     * assume backward scan, load so that target area is top of window.
     * Note that when switching from forward write to forward read, will have
     * start_row = 0, so the limiting case applies and we load from 0 anyway.
     */
    if (start_row > ptr->cur_start_row) {
      ptr->cur_start_row = start_row;
    } else {
      /* use long arithmetic here to avoid overflow & unsigned problems */
      long ltemp;

      ltemp = (long)end_row - (long)ptr->rows_in_mem;
      if (ltemp < 0)
        ltemp = 0;              /* don't fall off front end of file */
      ptr->cur_start_row = (JDIMENSION)ltemp;
    }
    /* Read in the selected part of the array.
     * During the initial write pass, we will do no actual read
     * because the selected part is all undefined.
     */
    do_barray_io(cinfo, ptr, FALSE);
  }
  /* Ensure the accessed part of the array is defined; prezero if needed.
   * To improve locality of access, we only prezero the part of the array
   * that the caller is about to access, not the entire in-memory array.
   */
  if (ptr->first_undef_row < end_row) {
    if (ptr->first_undef_row < start_row) {
      if (writable)             /* writer skipped over a section of array */
        ERREXIT(cinfo, JERR_BAD_VIRTUAL_ACCESS);
      undef_row = start_row;    /* but reader is allowed to read ahead */
    } else {
      undef_row = ptr->first_undef_row;
    }
    if (writable)
      ptr->first_undef_row = end_row;
    if (ptr->pre_zero) {
      size_t bytesperrow = (size_t)ptr->blocksperrow * sizeof(JBLOCK);
      undef_row -= ptr->cur_start_row; /* make indexes relative to buffer */
      end_row -= ptr->cur_start_row;
      while (undef_row < end_row) {
        jzero_far((void *)ptr->mem_buffer[undef_row], bytesperrow);
        undef_row++;
      }
    } else {
      if (!writable)            /* reader looking at undefined data */
        ERREXIT(cinfo, JERR_BAD_VIRTUAL_ACCESS);
    }
  }
  /* Flag the buffer dirty if caller will write in it */
  if (writable)
    ptr->dirty = TRUE;
  /* Return address of proper part of the buffer */
  return ptr->mem_buffer + (start_row - ptr->cur_start_row);
}